

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::typeDetails::typeDetails
          (typeDetails *this,GLuint n_columns,GLuint n_rows)

{
  _variable_type type;
  GLenum GVar1;
  generalType gVar2;
  _variable_type type_00;
  string local_40;
  
  this->m_n_columns = n_columns;
  this->m_n_rows = n_rows;
  (this->m_type_name)._M_dataplus._M_p = (pointer)&(this->m_type_name).field_2;
  (this->m_type_name)._M_string_length = 0;
  (this->m_type_name).field_2._M_local_buf[0] = '\0';
  type = Utils::getDoubleVariableType::types[n_columns - 1][n_rows - 1];
  GVar1 = Utils::getGLDataTypeOfVariableType(type);
  this->m_type = GVar1;
  Utils::getVariableTypeString_abi_cxx11_(&local_40,(Utils *)(ulong)type,type_00);
  std::__cxx11::string::operator=((string *)&this->m_type_name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  gVar2 = MATRIX;
  if (this->m_n_columns == 1) {
    gVar2 = (generalType)(this->m_n_rows != 1);
  }
  this->m_general_type = gVar2;
  return;
}

Assistant:

GPUShaderFP64Test10::typeDetails::typeDetails(glw::GLuint n_columns, glw::GLuint n_rows)
	: m_n_columns(n_columns), m_n_rows(n_rows)
{
	Utils::_variable_type type = Utils::getDoubleVariableType(n_columns, n_rows);
	m_type					   = Utils::getGLDataTypeOfVariableType(type);
	m_type_name				   = Utils::getVariableTypeString(type);

	if (1 == m_n_columns)
	{
		if (1 == m_n_rows)
		{
			m_general_type = SCALAR;
		}
		else
		{
			m_general_type = VECTOR;
		}
	}
	else
	{
		m_general_type = MATRIX;
	}
}